

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZVec<double>,_10>::Resize(TPZManVector<TPZVec<double>,_10> *this,int64_t newsize)

{
  ostream *poVar1;
  ulong *puVar2;
  TPZVec<double> *pTVar3;
  long lVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  ulong uVar7;
  TPZVec<double> *pTVar8;
  double dVar9;
  
  if (-1 < newsize) {
    lVar4 = (this->super_TPZVec<TPZVec<double>_>).fNElements;
    if (lVar4 != newsize) {
      lVar5 = (this->super_TPZVec<TPZVec<double>_>).fNAlloc;
      if (lVar5 < newsize) {
        if ((ulong)newsize < 0xb) {
          pTVar8 = this->fExtAlloc;
          if ((this->super_TPZVec<TPZVec<double>_>).fStore != pTVar8) {
            lVar5 = 0;
            for (lVar6 = 0; pTVar3 = (this->super_TPZVec<TPZVec<double>_>).fStore, lVar6 < lVar4;
                lVar6 = lVar6 + 1) {
              TPZVec<double>::operator=
                        ((TPZVec<double> *)((long)&pTVar8->_vptr_TPZVec + lVar5),
                         (TPZVec<double> *)((long)&pTVar3->_vptr_TPZVec + lVar5));
              lVar4 = (this->super_TPZVec<TPZVec<double>_>).fNElements;
              lVar5 = lVar5 + 0x20;
            }
            if (pTVar3 != (TPZVec<double> *)0x0) {
              lVar4 = pTVar3[-1].fNAlloc;
              if (lVar4 != 0) {
                lVar5 = lVar4 << 5;
                do {
                  TPZVec<double>::~TPZVec
                            ((TPZVec<double> *)((long)&pTVar3[-1]._vptr_TPZVec + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != 0);
              }
              operator_delete__(&pTVar3[-1].fNAlloc,lVar4 << 5 | 8);
            }
            (this->super_TPZVec<TPZVec<double>_>).fStore = pTVar8;
          }
          (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZVec<double>_>).fNAlloc = 0;
        }
        else {
          dVar9 = (double)lVar5 * 1.2;
          uVar7 = (long)dVar9;
          if (dVar9 < (double)newsize) {
            uVar7 = newsize;
          }
          puVar2 = (ulong *)operator_new__(-(ulong)(uVar7 >> 0x3b != 0) | uVar7 * 0x20 | 8);
          *puVar2 = uVar7;
          pTVar8 = (TPZVec<double> *)(puVar2 + 1);
          if (uVar7 != 0) {
            pTVar3 = pTVar8;
            do {
              pTVar3->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
              pTVar3->fNAlloc = 0;
              pTVar3->fStore = (double *)0x0;
              pTVar3->fNElements = 0;
              pTVar3 = pTVar3 + 1;
            } while (pTVar3 != pTVar8 + uVar7);
          }
          lVar5 = 0;
          for (lVar6 = 0; pTVar3 = (this->super_TPZVec<TPZVec<double>_>).fStore, lVar6 < lVar4;
              lVar6 = lVar6 + 1) {
            TPZVec<double>::operator=
                      ((TPZVec<double> *)((long)&pTVar8->_vptr_TPZVec + lVar5),
                       (TPZVec<double> *)((long)&pTVar3->_vptr_TPZVec + lVar5));
            lVar4 = (this->super_TPZVec<TPZVec<double>_>).fNElements;
            lVar5 = lVar5 + 0x20;
          }
          if (pTVar3 != (TPZVec<double> *)0x0 && pTVar3 != this->fExtAlloc) {
            lVar4 = pTVar3[-1].fNAlloc;
            if (lVar4 != 0) {
              lVar5 = lVar4 << 5;
              do {
                TPZVec<double>::~TPZVec((TPZVec<double> *)((long)&pTVar3[-1]._vptr_TPZVec + lVar5));
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != 0);
            }
            operator_delete__(&pTVar3[-1].fNAlloc,lVar4 << 5 | 8);
          }
          (this->super_TPZVec<TPZVec<double>_>).fStore = pTVar8;
          (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZVec<double>_>).fNAlloc = uVar7;
        }
      }
      else {
        (this->super_TPZVec<TPZVec<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}